

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O0

void spvPushOperandTypesForMask
               (spv_target_env env,spv_operand_table operandTable,spv_operand_type_t type,
               uint32_t mask,spv_operand_pattern_t *pattern)

{
  spv_result_t sVar1;
  spv_operand_desc local_38;
  spv_operand_desc entry;
  spv_operand_pattern_t *psStack_28;
  uint32_t candidate_bit;
  spv_operand_pattern_t *pattern_local;
  uint32_t mask_local;
  spv_operand_type_t type_local;
  spv_operand_table operandTable_local;
  spv_target_env env_local;
  
  psStack_28 = pattern;
  pattern_local._0_4_ = mask;
  pattern_local._4_4_ = type;
  _mask_local = operandTable;
  operandTable_local._4_4_ = env;
  for (entry._4_4_ = 0x80000000; entry._4_4_ != 0; entry._4_4_ = entry._4_4_ >> 1) {
    if ((entry._4_4_ & (uint32_t)pattern_local) != 0) {
      local_38 = (spv_operand_desc)0x0;
      sVar1 = spvOperandTableValueLookup
                        (operandTable_local._4_4_,_mask_local,pattern_local._4_4_,entry._4_4_,
                         &local_38);
      if (sVar1 == SPV_SUCCESS) {
        spvPushOperandTypes(local_38->operandTypes,psStack_28);
      }
    }
  }
  return;
}

Assistant:

void spvPushOperandTypesForMask(spv_target_env env,
                                const spv_operand_table operandTable,
                                const spv_operand_type_t type,
                                const uint32_t mask,
                                spv_operand_pattern_t* pattern) {
  // Scan from highest bits to lowest bits because we will append in LIFO
  // fashion, and we need the operands for lower order bits to be consumed first
  for (uint32_t candidate_bit = (1u << 31u); candidate_bit;
       candidate_bit >>= 1) {
    if (candidate_bit & mask) {
      spv_operand_desc entry = nullptr;
      if (SPV_SUCCESS == spvOperandTableValueLookup(env, operandTable, type,
                                                    candidate_bit, &entry)) {
        spvPushOperandTypes(entry->operandTypes, pattern);
      }
    }
  }
}